

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O1

void Wln_WriteVer(Wln_Ntk_t *p,char *pFileName)

{
  char *pcVar1;
  FILE *__stream;
  char *pcVar2;
  char *pcVar3;
  
  __stream = fopen(pFileName,"w");
  if (__stream != (FILE *)0x0) {
    pcVar1 = p->pName;
    pcVar3 = "unknown";
    if (p->pSpec != (char *)0x0) {
      pcVar3 = p->pSpec;
    }
    pcVar2 = Extra_TimeStamp();
    fprintf(__stream,"// Benchmark \"%s\" from file \"%s\" written by ABC on %s\n",pcVar1,pcVar3,
            pcVar2);
    fputc(10,__stream);
    Wln_WriteTables((FILE *)__stream,p);
    Wln_WriteVerInt((FILE *)__stream,p);
    fputc(10,__stream);
    fclose(__stream);
    return;
  }
  fprintf(_stdout,"Wln_WriteVer(): Cannot open the output file \"%s\".\n",pFileName);
  return;
}

Assistant:

void Wln_WriteVer( Wln_Ntk_t * p, char * pFileName )
{
    FILE * pFile;
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Wln_WriteVer(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }
    fprintf( pFile, "// Benchmark \"%s\" from file \"%s\" written by ABC on %s\n", p->pName, p->pSpec ? p->pSpec : "unknown", Extra_TimeStamp() );
    fprintf( pFile, "\n" );
    Wln_WriteTables( pFile, p );
//    if ( fAddCos )
//        Wln_WriteAddPos( p );
    Wln_WriteVerInt( pFile, p );
    fprintf( pFile, "\n" );
    fclose( pFile );
}